

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O3

s32 __thiscall irr::gui::CGUITabControl::calculateScrollIndexFromActive(CGUITabControl *this)

{
  ulong uVar1;
  int iVar2;
  IGUITab *pIVar3;
  bool bVar4;
  s32 in_EAX;
  int iVar5;
  int iVar6;
  long *plVar7;
  undefined8 uVar8;
  int iVar9;
  s32 sVar10;
  int iVar11;
  ulong uVar12;
  s32 pos_rr;
  undefined8 local_38;
  
  sVar10 = 0;
  if ((this->ScrollControl == true) &&
     ((this->Tabs).m_data.
      super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->Tabs).m_data.
      super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    local_38._0_4_ = in_EAX;
    plVar7 = (long *)(**(code **)(**(long **)&this->field_0x128 + 0x60))();
    if (plVar7 != (long *)0x0) {
      sVar10 = 0;
      plVar7 = (long *)(**(code **)(*plVar7 + 0x30))(plVar7,0);
      if (plVar7 != (long *)0x0) {
        iVar11 = (this->UpButton->super_IGUIElement).AbsoluteRect.UpperLeftCorner.X;
        uVar12 = (ulong)this->ActiveTabIndex;
        local_38 = CONCAT44(iVar11,(s32)local_38);
        if (0 < (long)uVar12) {
          iVar2 = *(int *)&this->field_0x40;
          iVar11 = (iVar2 + iVar11) / 2;
          do {
            pIVar3 = (this->Tabs).m_data.
                     super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar12];
            if (pIVar3 != (IGUITab *)0x0) {
              uVar8 = (**(code **)(*(long *)&(pIVar3->super_IGUIElement).super_IEventReceiver + 0xa8
                                  ))();
              iVar5 = (**(code **)(*plVar7 + 8))(plVar7,uVar8);
              iVar5 = iVar5 + this->TabExtraWidth;
              iVar9 = this->TabMaxWidth;
              iVar6 = iVar9;
              if (iVar5 < iVar9) {
                iVar6 = iVar5;
              }
              if (iVar9 < 1) {
                iVar6 = iVar5;
              }
              iVar9 = iVar6 / 2;
              if (uVar12 != (uint)this->ActiveTabIndex) {
                iVar9 = iVar6;
              }
              iVar11 = iVar11 - iVar9;
              if (iVar11 < iVar2 + 2) goto LAB_00226af7;
            }
            uVar1 = uVar12 - 1;
            bVar4 = 1 < (long)uVar12;
            uVar12 = uVar1;
          } while (bVar4);
          uVar12 = uVar1 & 0xffffffff;
        }
        if ((int)uVar12 != 0) {
LAB_00226af7:
          local_38 = local_38 & 0xffffffff00000000;
          bVar4 = needScrollControl(this,(s32)uVar12,true,(s32 *)&local_38);
          if ((1 < (s32)uVar12) && (!bVar4)) {
            iVar11 = local_38._4_4_ + -2;
            uVar12 = uVar12 & 0xffffffff;
            do {
              pIVar3 = (this->Tabs).m_data.
                       super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar12 - 1];
              if (pIVar3 != (IGUITab *)0x0) {
                uVar8 = (**(code **)(*(long *)&(pIVar3->super_IGUIElement).super_IEventReceiver +
                                    0xa8))();
                iVar6 = (**(code **)(*plVar7 + 8))(plVar7,uVar8);
                iVar6 = iVar6 + this->TabExtraWidth;
                iVar2 = this->TabMaxWidth;
                iVar9 = iVar2;
                if (iVar6 < iVar2) {
                  iVar9 = iVar6;
                }
                if (iVar2 < 1) {
                  iVar9 = iVar6;
                }
                iVar9 = iVar9 + (s32)local_38;
                local_38 = CONCAT44(local_38._4_4_,iVar9);
                if (iVar11 < iVar9) goto LAB_00226b7f;
              }
              bVar4 = 2 < uVar12;
              uVar12 = uVar12 - 1;
            } while (bVar4);
            uVar12 = 1;
          }
LAB_00226b7f:
          sVar10 = (s32)uVar12;
        }
      }
    }
  }
  return sVar10;
}

Assistant:

s32 CGUITabControl::calculateScrollIndexFromActive()
{
	if (!ScrollControl || Tabs.empty())
		return 0;

	IGUISkin *skin = Environment->getSkin();
	if (!skin)
		return false;

	IGUIFont *font = skin->getFont();
	if (!font)
		return false;

	const s32 pos_left = AbsoluteRect.UpperLeftCorner.X + 2;
	const s32 pos_right = UpButton->getAbsolutePosition().UpperLeftCorner.X - 2;

	// Move from center to the left border left until it is reached
	s32 pos_cl = (pos_left + pos_right) / 2;
	s32 i = ActiveTabIndex;
	for (; i > 0; --i) {
		if (!Tabs[i])
			continue;

		s32 len = calcTabWidth(font, Tabs[i]->getText());
		if (i == ActiveTabIndex)
			len /= 2;
		if (pos_cl - len < pos_left)
			break;

		pos_cl -= len;
	}
	if (i == 0)
		return i;

	// Is scrolling to right still possible?
	s32 pos_rr = 0;
	if (needScrollControl(i, true, &pos_rr))
		return i; // Yes? -> OK

	// No? -> Decrease "i" more. Append tabs until scrolling becomes necessary
	for (--i; i > 0; --i) {
		if (!Tabs[i])
			continue;

		pos_rr += calcTabWidth(font, Tabs[i]->getText());
		if (pos_rr > pos_right)
			break;
	}
	return i + 1;
}